

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O2

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionC
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar1;
  double dVar2;
  complex<double> cVar3;
  complex<double> g;
  undefined8 local_108;
  complex<double> local_68;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  double local_10;
  
  dVar2 = omega;
  HestonModel::getRiskFreeRate(this->hestonModel_);
  HestonModel::getDrift(this->hestonModel_);
  HestonModel::getMeanReversionSpeed(this->hestonModel_);
  HestonModel::getMeanReversionLevel(this->hestonModel_);
  HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  bTerm(this,omega);
  local_108 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  dVar1 = dVar2;
  gTerm(this,omega);
  local_18 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  local_68._M_value._8_4_ = SUB84(-dVar2 * tau,0);
  local_68._M_value._0_8_ = -local_108 * tau;
  local_68._M_value._12_4_ = (int)((ulong)(-dVar2 * tau) >> 0x20);
  local_10 = dVar1;
  std::exp<double>(&local_68);
  local_48._8_8_ = tau;
  std::operator*((complex<double> *)&local_18,(complex<double> *)local_48);
  dVar2 = -tau;
  local_38 = 1.0 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_58 = 1.0 - local_18;
  local_50 = -local_10;
  local_30 = dVar2;
  std::operator/((complex<double> *)&local_38,(complex<double> *)&local_58);
  local_28._8_8_ = dVar2;
  cVar3 = std::log<double>((complex<double> *)local_28);
  return (complex<double>)cVar3._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionC(double tau, double omega) const {
    double r = hestonModel_->getRiskFreeRate(),
           mu = hestonModel_->getDrift(),
           kappa = hestonModel_->getMeanReversionSpeed(),
           theta = hestonModel_->getMeanReversionLevel(),
           sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega),
                        b = bTerm(omega),
                        g = gTerm(omega);
    return tau*(j * omega*mu - r)+ kappa * theta / (sigma*sigma) * ((a-b)*tau-2.*std::log((1.-g*std::exp(-b*tau))/(1.-g))) ; // definition in class
    // return tau * r * (j * omega - 1.)+ kappa * theta / (sigma*sigma) * ((a+b)*tau-2.*std::log((1.-g*std::exp(b*tau))/(1.-g))) ; // definition in PDF
}